

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O1

bool check_location_aliasing
               (explicit_location_info (*explicit_locations) [4],ir_variable *var,uint location,
               uint component,uint location_limit,glsl_type *type,uint interpolation,bool centroid,
               bool sample,bool patch,gl_shader_program *prog,gl_shader_stage stage)

{
  explicit_location_info *peVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  glsl_type *t_1;
  ir_variable *piVar7;
  char *pcVar8;
  ulong uVar9;
  byte bVar10;
  char *pcVar11;
  uint uVar12;
  char *fmt;
  uint local_58;
  uint local_54;
  
  for (; type->field_0x4 == '\x11'; type = (glsl_type *)(type->fields).parameters) {
  }
  uVar3 = *(uint *)&type->field_0x4;
  local_58 = 0;
  cVar2 = false;
  uVar12 = uVar3 & 0xff;
  if ((byte)uVar3 < 0xe) {
    cVar2 = (&DAT_0022ec4c)[uVar3 & 0xf];
  }
  uVar5 = 4;
  local_54 = component;
  if (uVar12 == 0xf) goto LAB_001f06aa;
  uVar5 = (uVar3 & 0xff) - 4;
  bVar10 = 0;
  if ((byte)uVar5 < 10) {
    bVar10 = (byte)*(undefined4 *)(&DAT_0022ec5c + (ulong)(uVar5 & 0xff) * 4);
  }
  if (0x13 < uVar12) {
switchD_001f0678_caseD_e:
    __assert_fail("!\"unknown base type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.h"
                  ,0xbe,"unsigned int glsl_base_type_get_bit_size(const enum glsl_base_type)");
  }
  uVar5 = ((uint)type->vector_elements << (bVar10 & 0x1f)) + component;
  switch(uVar12) {
  case 0:
  case 1:
  case 2:
  case 0x13:
    local_58 = 0x20;
    break;
  case 3:
  case 7:
  case 8:
    local_58 = 0x10;
    break;
  default:
    local_58 = 0x40;
    break;
  case 5:
  case 6:
    local_58 = 8;
    break;
  case 0xb:
    local_58 = 1;
    break;
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
    goto switchD_001f0678_caseD_e;
  }
LAB_001f06aa:
  do {
    uVar12 = location;
    if (location_limit <= uVar12) break;
    uVar9 = 0;
    location = uVar12;
    do {
      uVar6 = (uint)uVar9;
      if (3 < uVar6) {
        location = location + 1;
        break;
      }
      peVar1 = explicit_locations[location] + uVar9;
      piVar7 = peVar1->var;
      if (piVar7 == (ir_variable *)0x0) {
        if ((local_54 <= uVar6) && (uVar6 < uVar5)) {
          peVar1->var = var;
          peVar1->base_type_is_integer = (bool)cVar2;
          peVar1->base_type_bit_size = local_58;
          peVar1->interpolation = interpolation;
          peVar1->centroid = centroid;
          peVar1->sample = sample;
          peVar1->patch = patch;
        }
LAB_001f07a8:
        uVar9 = (ulong)(uVar6 + 1);
        bVar4 = true;
        if ((uVar6 + 1 == 4) && (4 < uVar5)) {
          uVar5 = uVar5 - 4;
          location = location + 1;
          local_54 = 0;
          uVar9 = 0;
        }
      }
      else {
        do {
          piVar7 = (ir_variable *)piVar7->type;
        } while (*(char *)((long)&(piVar7->super_ir_instruction)._vptr_ir_instruction + 4) == '\x11'
                );
        if (((uVar3 & 0xff) == 0xf) ||
           (*(char *)((long)&(piVar7->super_ir_instruction)._vptr_ir_instruction + 4) == '\x0f')) {
          pcVar8 = _mesa_shader_stage_to_string(stage);
          pcVar11 = " out";
          if (((undefined1  [44])var->data & (undefined1  [44])0xf000) == (undefined1  [44])0x4000)
          {
            pcVar11 = " in";
          }
          piVar7 = var;
          if ((uVar3 & 0xff) != 0xf) {
            piVar7 = peVar1->var;
          }
          bVar4 = false;
          linker_error(prog,
                       "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical type. Struct variable \'%s\', location %u\n"
                       ,pcVar8,pcVar11 + 1,piVar7->name,(ulong)location);
        }
        else {
          if ((uVar6 < local_54) || (uVar5 <= uVar6)) {
            if (peVar1->base_type_is_integer == (bool)cVar2) {
              if (peVar1->base_type_bit_size == local_58) {
                if (peVar1->interpolation == interpolation) {
                  if (((peVar1->centroid == centroid) && (peVar1->sample == sample)) &&
                     (peVar1->patch == patch)) goto LAB_001f07a8;
                  pcVar8 = _mesa_shader_stage_to_string(stage);
                  pcVar11 = " out";
                  if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                      (undefined1  [44])0x4000) {
                    pcVar11 = " in";
                  }
                  pcVar11 = pcVar11 + 1;
                  fmt = 
                  "%s shader has multiple %sputs sharing the same location that don\'t have the same auxiliary storage qualification. Location %u component %u.\n"
                  ;
                }
                else {
                  pcVar8 = _mesa_shader_stage_to_string(stage);
                  pcVar11 = " out";
                  if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                      (undefined1  [44])0x4000) {
                    pcVar11 = " in";
                  }
                  pcVar11 = pcVar11 + 1;
                  fmt = 
                  "%s shader has multiple %sputs sharing the same location that don\'t have the same interpolation qualification. Location %u component %u.\n"
                  ;
                }
              }
              else {
                pcVar8 = _mesa_shader_stage_to_string(stage);
                pcVar11 = " out";
                if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                    (undefined1  [44])0x4000) {
                  pcVar11 = " in";
                }
                pcVar11 = pcVar11 + 1;
                fmt = 
                "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical bit size. Location %u component %u.\n"
                ;
              }
            }
            else {
              pcVar8 = _mesa_shader_stage_to_string(stage);
              pcVar11 = " out";
              if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                  (undefined1  [44])0x4000) {
                pcVar11 = " in";
              }
              pcVar11 = pcVar11 + 1;
              fmt = 
              "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical type. Location %u component %u.\n"
              ;
            }
          }
          else {
            pcVar8 = _mesa_shader_stage_to_string(stage);
            pcVar11 = " out";
            if (((undefined1  [44])var->data & (undefined1  [44])0xf000) == (undefined1  [44])0x4000
               ) {
              pcVar11 = " in";
            }
            pcVar11 = pcVar11 + 1;
            fmt = 
            "%s shader has multiple %sputs explicitly assigned to location %d and component %d\n";
          }
          bVar4 = false;
          linker_error(prog,fmt,pcVar8,pcVar11,(ulong)location,uVar9);
        }
      }
    } while (bVar4);
  } while (3 < uVar6);
  return location_limit <= uVar12;
}

Assistant:

static bool
check_location_aliasing(struct explicit_location_info explicit_locations[][4],
                        ir_variable *var,
                        unsigned location,
                        unsigned component,
                        unsigned location_limit,
                        const glsl_type *type,
                        unsigned interpolation,
                        bool centroid,
                        bool sample,
                        bool patch,
                        gl_shader_program *prog,
                        gl_shader_stage stage)
{
   unsigned last_comp;
   unsigned base_type_bit_size;
   const glsl_type *type_without_array = type->without_array();
   const bool base_type_is_integer =
      glsl_base_type_is_integer(type_without_array->base_type);
   const bool is_struct = type_without_array->is_struct();
   if (is_struct) {
      /* structs don't have a defined underlying base type so just treat all
       * component slots as used and set the bit size to 0. If there is
       * location aliasing, we'll fail anyway later.
       */
      last_comp = 4;
      base_type_bit_size = 0;
   } else {
      unsigned dmul = type_without_array->is_64bit() ? 2 : 1;
      last_comp = component + type_without_array->vector_elements * dmul;
      base_type_bit_size =
         glsl_base_type_get_bit_size(type_without_array->base_type);
   }

   while (location < location_limit) {
      unsigned comp = 0;
      while (comp < 4) {
         struct explicit_location_info *info =
            &explicit_locations[location][comp];

         if (info->var) {
            if (info->var->type->without_array()->is_struct() || is_struct) {
               /* Structs cannot share location since they are incompatible
                * with any other underlying numerical type.
                */
               linker_error(prog,
                            "%s shader has multiple %sputs sharing the "
                            "same location that don't have the same "
                            "underlying numerical type. Struct variable '%s', "
                            "location %u\n",
                            _mesa_shader_stage_to_string(stage),
                            var->data.mode == ir_var_shader_in ? "in" : "out",
                            is_struct ? var->name : info->var->name,
                            location);
               return false;
            } else if (comp >= component && comp < last_comp) {
               /* Component aliasing is not allowed */
               linker_error(prog,
                            "%s shader has multiple %sputs explicitly "
                            "assigned to location %d and component %d\n",
                            _mesa_shader_stage_to_string(stage),
                            var->data.mode == ir_var_shader_in ? "in" : "out",
                            location, comp);
               return false;
            } else {
               /* From the OpenGL 4.60.5 spec, section 4.4.1 Input Layout
                * Qualifiers, Page 67, (Location aliasing):
                *
                *   " Further, when location aliasing, the aliases sharing the
                *     location must have the same underlying numerical type
                *     and bit width (floating-point or integer, 32-bit versus
                *     64-bit, etc.) and the same auxiliary storage and
                *     interpolation qualification."
                */

               /* If the underlying numerical type isn't integer, implicitly
                * it will be float or else we would have failed by now.
                */
               if (info->base_type_is_integer != base_type_is_integer) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "underlying numerical type. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->base_type_bit_size != base_type_bit_size) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "underlying numerical bit size. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->interpolation != interpolation) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "interpolation qualification. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->centroid != centroid ||
                   info->sample != sample ||
                   info->patch != patch) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "auxiliary storage qualification. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }
            }
         } else if (comp >= component && comp < last_comp) {
            info->var = var;
            info->base_type_is_integer = base_type_is_integer;
            info->base_type_bit_size = base_type_bit_size;
            info->interpolation = interpolation;
            info->centroid = centroid;
            info->sample = sample;
            info->patch = patch;
         }

         comp++;

         /* We need to do some special handling for doubles as dvec3 and
          * dvec4 consume two consecutive locations. We don't need to
          * worry about components beginning at anything other than 0 as
          * the spec does not allow this for dvec3 and dvec4.
          */
         if (comp == 4 && last_comp > 4) {
            last_comp = last_comp - 4;
            /* Bump location index and reset the component index */
            location++;
            comp = 0;
            component = 0;
         }
      }

      location++;
   }

   return true;
}